

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

void FSE_initDState(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD,FSE_DTable *dt)

{
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  FSE_DTableHeader *DTableH;
  void *ptr;
  FSE_DTable *dt_local;
  BIT_DStream_t *bitD_local;
  FSE_DState_t *DStatePtr_local;
  BIT_DStream_status result;
  U32 nbBytes;
  size_t value;
  U32 regMask;
  
  uVar1 = (ushort)*dt;
  uVar2 = bitD->bitsConsumed;
  if (0x1f < uVar1) {
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                  ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
  }
  bitD->bitsConsumed = (uint)uVar1 + bitD->bitsConsumed;
  DStatePtr->state =
       bitD->bitContainer >> (('@' - (char)uVar2) - (byte)uVar1 & 0x3f) &
       (1L << ((byte)uVar1 & 0x3f)) - 1U;
  if (bitD->bitsConsumed < 0x41) {
    if (bitD->ptr < bitD->limitPtr) {
      if (bitD->ptr != bitD->start) {
        DStatePtr_local._4_4_ = bitD->bitsConsumed >> 3;
        if (bitD->ptr + -(ulong)DStatePtr_local._4_4_ < bitD->start) {
          DStatePtr_local._4_4_ = (int)bitD->ptr - (int)bitD->start;
        }
        bitD->ptr = bitD->ptr + -(ulong)DStatePtr_local._4_4_;
        bitD->bitsConsumed = bitD->bitsConsumed + DStatePtr_local._4_4_ * -8;
        sVar3 = MEM_readLEST(bitD->ptr);
        bitD->bitContainer = sVar3;
      }
    }
    else {
      BIT_reloadDStreamFast(bitD);
    }
  }
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

MEM_STATIC void FSE_initDState(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD, const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* const DTableH = (const FSE_DTableHeader*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}